

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O2

bool __thiscall draco::ObjDecoder::ParseVertexIndices(ObjDecoder *this,array<int,_3UL> *out_indices)

{
  DecoderBuffer *buffer;
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  buffer = &this->buffer_;
  parser::SkipCharacters(buffer," \t");
  bVar2 = parser::ParseSignedInt(buffer,out_indices->_M_elems);
  if ((bVar2) && (out_indices->_M_elems[0] != 0)) {
    out_indices->_M_elems[1] = 0;
    out_indices->_M_elems[2] = 0;
    lVar4 = (this->buffer_).data_size_;
    lVar1 = (this->buffer_).pos_;
    lVar3 = lVar1 + 1;
    if (lVar4 < lVar3) {
      return true;
    }
    if (buffer->data_[lVar1] != '/') {
      return true;
    }
    (this->buffer_).pos_ = lVar3;
    if (lVar1 + 2 <= lVar4) {
      if (buffer->data_[lVar3] != '/') {
        bVar2 = parser::ParseSignedInt(buffer,out_indices->_M_elems + 1);
        if (!bVar2) {
          return false;
        }
        if (out_indices->_M_elems[1] == 0) {
          return false;
        }
        lVar4 = (this->buffer_).data_size_;
        lVar3 = (this->buffer_).pos_;
      }
      if (lVar4 < lVar3 + 1) {
        return true;
      }
      if (buffer->data_[lVar3] != '/') {
        return true;
      }
      (this->buffer_).pos_ = lVar3 + 1;
      bVar2 = parser::ParseSignedInt(buffer,out_indices->_M_elems + 2);
      if ((bVar2) && (out_indices->_M_elems[2] != 0)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ObjDecoder::ParseVertexIndices(std::array<int32_t, 3> *out_indices) {
  // Parsed attribute indices can be in format:
  // 1. POS_INDEX
  // 2. POS_INDEX/TEX_COORD_INDEX
  // 3. POS_INDEX/TEX_COORD_INDEX/NORMAL_INDEX
  // 4. POS_INDEX//NORMAL_INDEX
  parser::SkipCharacters(buffer(), " \t");
  if (!parser::ParseSignedInt(buffer(), &(*out_indices)[0]) ||
      (*out_indices)[0] == 0) {
    return false;  // Position index must be present and valid.
  }
  (*out_indices)[1] = (*out_indices)[2] = 0;
  char ch;
  if (!buffer()->Peek(&ch)) {
    return true;  // It may be OK if we cannot read any more characters.
  }
  if (ch != '/') {
    return true;
  }
  buffer()->Advance(1);
  // Check if we should skip texture index or not.
  if (!buffer()->Peek(&ch)) {
    return false;  // Here, we should be always able to read the next char.
  }
  if (ch != '/') {
    // Must be texture coord index.
    if (!parser::ParseSignedInt(buffer(), &(*out_indices)[1]) ||
        (*out_indices)[1] == 0) {
      return false;  // Texture index must be present and valid.
    }
  }
  if (!buffer()->Peek(&ch)) {
    return true;
  }
  if (ch == '/') {
    buffer()->Advance(1);
    // Read normal index.
    if (!parser::ParseSignedInt(buffer(), &(*out_indices)[2]) ||
        (*out_indices)[2] == 0) {
      return false;  // Normal index must be present and valid.
    }
  }
  return true;
}